

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

void __thiscall JsonString_BadEscape1_Test::TestBody(JsonString_BadEscape1_Test *this)

{
  parser<callbacks_proxy<mock_json_callbacks>_> *this_00;
  extensions in_ECX;
  char *pcVar1;
  coord local_d0;
  error_code local_c8;
  AssertionResult gtest_ar;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  
  pstore::json::make_parser<callbacks_proxy<mock_json_callbacks>>
            (&p,(json *)&(this->super_JsonString).proxy_,(callbacks_proxy<mock_json_callbacks> *)0x0
             ,in_ECX);
  this_00 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input(&p,"\"a\\qb\"");
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_00);
  local_c8._M_cat = pstore::json::get_error_category();
  local_c8._M_value = 9;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&gtest_ar,"p.last_error ()",
             "make_error_code (json::error_code::invalid_escape_char)",&p.error_,&local_c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_string.cpp"
               ,0x4f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((long *)local_c8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_c8._M_value = p.coordinate_.column;
  local_c8._4_4_ = p.coordinate_.row;
  local_d0.column = 4;
  local_d0.row = 1;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)&gtest_ar,"p.coordinate ()","(json::coord{4U, 1U})",(coord *)&local_c8,
             &local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_string.cpp"
               ,0x50,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((coord)local_c8._0_8_ != (coord)0x0) {
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser(&p);
  return;
}

Assistant:

TEST_F (JsonString, BadEscape1) {
    auto p = json::make_parser (proxy_);
    p.input (R"("a\qb")").eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::invalid_escape_char));
    EXPECT_EQ (p.coordinate (), (json::coord{4U, 1U}));
}